

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

uint64_t __thiscall leveldb::anon_unknown_0::ShardedLRUCache::NewId(ShardedLRUCache *this)

{
  uint64_t uVar1;
  
  std::mutex::lock(&(this->id_mutex_).mu_);
  uVar1 = this->last_id_ + 1;
  this->last_id_ = uVar1;
  pthread_mutex_unlock((pthread_mutex_t *)&this->id_mutex_);
  return uVar1;
}

Assistant:

uint64_t NewId() override {
    MutexLock l(&id_mutex_);
    return ++(last_id_);
  }